

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.cc
# Opt level: O2

int EVP_HPKE_CTX_open(EVP_HPKE_CTX *ctx,uint8_t *out,size_t *out_len,size_t max_out_len,uint8_t *in,
                     size_t in_len,uint8_t *ad,size_t ad_len)

{
  int iVar1;
  size_t nonce_len;
  int line;
  uint8_t nonce [32];
  
  if (ctx->is_sender == 0) {
    if (ctx->seq != 0xffffffffffffffff) {
      nonce_len = EVP_AEAD_nonce_length((ctx->aead_ctx).aead);
      hpke_nonce(ctx,nonce,nonce_len);
      iVar1 = EVP_AEAD_CTX_open(&ctx->aead_ctx,out,out_len,max_out_len,nonce,nonce_len,in,in_len,ad,
                                ad_len);
      if (iVar1 != 0) {
        ctx->seq = ctx->seq + 1;
        return 1;
      }
      return 0;
    }
    iVar1 = 0x45;
    line = 0x400;
  }
  else {
    iVar1 = 0x42;
    line = 0x3fc;
  }
  ERR_put_error(6,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke.cc"
                ,line);
  return 0;
}

Assistant:

int EVP_HPKE_CTX_open(EVP_HPKE_CTX *ctx, uint8_t *out, size_t *out_len,
                      size_t max_out_len, const uint8_t *in, size_t in_len,
                      const uint8_t *ad, size_t ad_len) {
  if (ctx->is_sender) {
    OPENSSL_PUT_ERROR(EVP, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return 0;
  }
  if (ctx->seq == UINT64_MAX) {
    OPENSSL_PUT_ERROR(EVP, ERR_R_OVERFLOW);
    return 0;
  }

  uint8_t nonce[EVP_AEAD_MAX_NONCE_LENGTH];
  const size_t nonce_len = EVP_AEAD_nonce_length(ctx->aead_ctx.aead);
  hpke_nonce(ctx, nonce, nonce_len);

  if (!EVP_AEAD_CTX_open(&ctx->aead_ctx, out, out_len, max_out_len, nonce,
                         nonce_len, in, in_len, ad, ad_len)) {
    return 0;
  }
  ctx->seq++;
  return 1;
}